

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::TreeEnsembleParameters::_InternalParse
          (TreeEnsembleParameters *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  uint uVar2;
  TreeEnsembleParameters_TreeNode *msg;
  uint64_t uVar3;
  RepeatedField<double> *object;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double value;
  uint local_24;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  TreeEnsembleParameters *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_003d865c:
  bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (char *)ctx_local;
  }
  ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_24,0);
  tag_00 = local_24;
  uVar2 = local_24 >> 3;
  if (uVar2 == 1) {
    if ((local_24 & 0xff) == 10) {
      ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
      do {
        this_00 = pPStack_20;
        ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
        msg = _internal_add_nodes(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg->super_MessageLite,(char *)ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                          (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
      } while ((bVar1) &&
              (bVar1 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar1));
      goto LAB_003d865c;
    }
  }
  else {
    if (uVar2 == 2) {
      if ((local_24 & 0xff) != 0x10) goto LAB_003d87f3;
      uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      this->numpredictiondimensions_ = uVar3;
      goto joined_r0x003d876c;
    }
    if (uVar2 == 3) {
      if ((local_24 & 0xff) == 0x1a) {
        object = _internal_mutable_basepredictionvalue(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::PackedDoubleParser
                              (object,(char *)ctx_local,pPStack_20);
        goto joined_r0x003d876c;
      }
      if ((local_24 & 0xff) != 0x19) goto LAB_003d87f3;
      value = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
      _internal_add_basepredictionvalue(this,value);
      ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
      goto LAB_003d865c;
    }
  }
LAB_003d87f3:
  if ((local_24 == 0) || ((local_24 & 7) == 4)) {
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    google::protobuf::internal::EpsCopyInputStream::SetLastTag
              (&pPStack_20->super_EpsCopyInputStream,local_24);
    return (char *)ctx_local;
  }
  unknown = google::protobuf::internal::InternalMetadata::
            mutable_unknown_fields<std::__cxx11::string>
                      (&(this->super_MessageLite)._internal_metadata_);
  ctx_local = (ParseContext *)
              google::protobuf::internal::UnknownFieldParse
                        (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x003d876c:
  if (ctx_local == (ParseContext *)0x0) {
    return (char *)0x0;
  }
  goto LAB_003d865c;
}

Assistant:

const char* TreeEnsembleParameters::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nodes(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // uint64 numPredictionDimensions = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          numpredictiondimensions_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated double basePredictionValue = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_basepredictionvalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 25) {
          _internal_add_basepredictionvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}